

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::ExceptionTranslatorRegistry::tryTranslators_abi_cxx11_
          (string *__return_storage_ptr__,ExceptionTranslatorRegistry *this)

{
  pointer ppIVar1;
  pointer __src;
  size_type sVar2;
  size_type __n;
  IExceptionTranslator **__dest;
  undefined8 *extraout_RDX;
  size_t sVar3;
  void *__dest_00;
  
  ppIVar1 = (this->m_translators).
            super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar1 !=
      (this->m_translators).
      super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (*(*ppIVar1)->_vptr_IExceptionTranslator[2])(__return_storage_ptr__,*ppIVar1,ppIVar1 + 1);
    return __return_storage_ptr__;
  }
  __cxa_rethrow();
  __n = std::
        vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
        ::_M_check_len((vector<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                        *)__return_storage_ptr__,1,"vector::_M_realloc_insert");
  __src = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  sVar3 = (long)this - (long)__src;
  if (__n == 0) {
    __dest = (IExceptionTranslator **)0x0;
  }
  else {
    __dest = __gnu_cxx::new_allocator<const_Catch::IExceptionTranslator_*>::allocate
                       ((new_allocator<const_Catch::IExceptionTranslator_*> *)__return_storage_ptr__
                        ,__n,(void *)0x0);
  }
  __dest[(long)sVar3 >> 3] = (IExceptionTranslator *)*extraout_RDX;
  if (0 < (long)sVar3) {
    memmove(__dest,__src,sVar3);
  }
  __dest_00 = (void *)((long)__dest + sVar3 + 8);
  sVar3 = sVar2 - (long)this;
  if (0 < (long)sVar3) {
    memmove(__dest_00,this,sVar3);
  }
  if (__src != (pointer)0x0) {
    operator_delete(__src,(__return_storage_ptr__->field_2)._M_allocated_capacity - (long)__src);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)__dest;
  __return_storage_ptr__->_M_string_length = (long)__dest_00 + sVar3;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)(__dest + __n);
  return (string *)(__dest + __n);
}

Assistant:

Generic::AnyOf<ExpressionT> Matcher<ExpressionT>::operator || ( Matcher<ExpressionT> const& other ) const {
        Generic::AnyOf<ExpressionT> anyOfExpr;
        anyOfExpr.add( *this );
        anyOfExpr.add( other );
        return anyOfExpr;
    }